

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

MCTOOLS_FILE_t * mctools_fopen(mcu8str *rawpath,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  mcu8str path;
  mcu8str s_1;
  char buf [4096];
  mcu8str local_1048;
  mcu8str local_1030;
  char local_1018 [4096];
  
  pcVar4 = rawpath->c_str;
  uVar5 = rawpath->size;
  local_1048.buflen = uVar5 + 1;
  local_1048.owns_memory = 0;
  local_1048.c_str = pcVar4;
  local_1048.size = uVar5;
  iVar1 = mctools_impl_has_winnamespace(rawpath);
  if (iVar1 != 0) {
    pcVar4 = pcVar4 + 4;
    uVar5 = uVar5 - 4;
    local_1048.c_str = pcVar4;
    local_1048.size = uVar5;
  }
  if (uVar5 != 0) {
    uVar3 = 0;
    do {
      if (pcVar4[uVar3] == '\\') {
        local_1030.owns_memory = 0;
        local_1030.c_str = local_1018;
        local_1018[0] = '\0';
        local_1030.size = 0;
        local_1030.buflen = 0x1000;
        mcu8str_assign(&local_1030,&local_1048);
        mctools_pathseps_platform(&local_1030);
        pcVar4 = local_1030.c_str;
        pFVar2 = fopen(local_1030.c_str,mode);
        if (pcVar4 != (char *)0x0 && local_1030.owns_memory != 0) {
          free(pcVar4);
        }
        return (MCTOOLS_FILE_t *)pFVar2;
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  pFVar2 = fopen(pcVar4,mode);
  return (MCTOOLS_FILE_t *)pFVar2;
}

Assistant:

MCTOOLS_FILE_t * mctools_fopen( const mcu8str* rawpath,
                                  const char * mode )
  {
    mcu8str path = mctools_impl_view_no_winnamespace( rawpath );

    //Utf8-encoded paths are used directly on platforms except Windows, where
    //only ASCII encoded paths can be used directly. We also run paths through
    //mctools_pathseps_platform.
#ifdef MC_IS_WINDOWS
    //Ok, non-ASCII path on windows. Reencode as wide strings and use _wfopen:
    mcwinstr wpath = mc_path2wpath( &path );//this also maps to native path sep
    char buf[32];
    mcu8str mcu8str_mode = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_append_cstr(&mcu8str_mode,mode);
    mcwinstr wmode = mc_u8str_to_winstr( &mcu8str_mode );
    //    MCTOOLS_FILE_t * result = _wfopen( wpath.c_str, wmode.c_str );//nb: no STDNS here on purpose
    MCTOOLS_FILE_t * result = NULL;
    errno_t errno_result = _wfopen_s( &result, wpath.c_str, wmode.c_str );
    mcu8str_dealloc(&mcu8str_mode);
    mc_winstr_dealloc( &wpath );
    mc_winstr_dealloc( &wmode );
    if ( errno_result != 0 ) {
      if ( result )
        fclose(result);//a bit weird, but most likely we won't get here.
      return NULL;
    }
    return result;
#else
    if ( !mcu8str_contains( &path, '\\' ) ) {
      //Usual case on unix -> no extra work needed
      return STDNS fopen( path.c_str, mode );
    } else {
      //Copy path so we can run it through mctools_pathseps_platform:
      char buf[4096];
      mcu8str pathcopy = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &pathcopy, &path );
      mctools_pathseps_platform( &pathcopy );
      MCTOOLS_FILE_t * fh = STDNS fopen( pathcopy.c_str, mode );
      mcu8str_dealloc(&pathcopy);
      return fh;
    }
#endif
  }